

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugLogV(char *fmt,__va_list_tag *args)

{
  int new_size;
  char *pcVar1;
  ImGuiTextIndex *in_RSI;
  __va_list_tag *unaff_retaddr;
  char *in_stack_00000008;
  ImGuiTextBuffer *in_stack_00000010;
  int old_size;
  ImGuiContext *g;
  ImGuiTextBuffer *in_stack_ffffffffffffffd0;
  int old_size_00;
  ImGuiContext *base;
  
  base = GImGui;
  new_size = ImGuiTextBuffer::size(&GImGui->DebugLogBuf);
  ImGuiTextBuffer::appendf(&base->DebugLogBuf,"[%05d] ",(ulong)(uint)base->FrameCount);
  ImGuiTextBuffer::appendfv(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if ((base->DebugLogFlags & 0x400U) != 0) {
    pcVar1 = ImGuiTextBuffer::begin(in_stack_ffffffffffffffd0);
    printf("%s",pcVar1 + new_size);
  }
  ImGuiTextBuffer::c_str(&base->DebugLogBuf);
  old_size_00 = new_size;
  ImGuiTextBuffer::size(&base->DebugLogBuf);
  ImGuiTextIndex::append(in_RSI,&base->Initialized,old_size_00,new_size);
  return;
}

Assistant:

void ImGui::DebugLogV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    const int old_size = g.DebugLogBuf.size();
    g.DebugLogBuf.appendf("[%05d] ", g.FrameCount);
    g.DebugLogBuf.appendfv(fmt, args);
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTTY)
        IMGUI_DEBUG_PRINTF("%s", g.DebugLogBuf.begin() + old_size);
    g.DebugLogIndex.append(g.DebugLogBuf.c_str(), old_size, g.DebugLogBuf.size());
}